

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::FatalConditionHandler::engage_platform(FatalConditionHandler *this)

{
  undefined1 *__oact;
  long lVar1;
  stack_t sigStack;
  sigaltstack local_d0;
  sigaction local_b8;
  
  local_d0.ss_sp = altStackMem;
  local_d0.ss_size = altStackSize;
  local_d0.ss_flags = 0;
  sigaltstack(&local_d0,(sigaltstack *)oldSigStack);
  lVar1 = 0;
  memset(&local_b8.sa_mask,0,0x90);
  local_b8.__sigaction_handler.sa_handler = handleSignal;
  local_b8.sa_flags = 0x8000000;
  __oact = oldSigActions;
  do {
    sigaction(*(int *)((long)&signalDefs + lVar1),&local_b8,(sigaction *)__oact);
    lVar1 = lVar1 + 0x10;
    __oact = (undefined1 *)((long)__oact + 0x98);
  } while (lVar1 != 0x60);
  return;
}

Assistant:

void FatalConditionHandler::engage_platform() {
        stack_t sigStack;
        sigStack.ss_sp = altStackMem;
        sigStack.ss_size = altStackSize;
        sigStack.ss_flags = 0;
        sigaltstack(&sigStack, &oldSigStack);
        struct sigaction sa = { };

        sa.sa_handler = handleSignal;
        sa.sa_flags = SA_ONSTACK;
        for (std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i) {
            sigaction(signalDefs[i].id, &sa, &oldSigActions[i]);
        }
    }